

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::Stop(Debugger *this)

{
  unique_lock<std::mutex> luaThreadLock;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  this->running = false;
  this->skipHook = true;
  this->blocking = false;
  std::mutex::lock(&this->hookStateMtx);
  local_28 = (undefined1  [8])0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  pthread_mutex_unlock((pthread_mutex_t *)&this->hookStateMtx);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->luaThreadMtx)
  ;
  std::
  vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>::
  clear(&this->luaThreadExecutors);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  ExitDebugMode(this);
  return;
}

Assistant:

void Debugger::Stop() {
	running = false;
	skipHook = true;
	blocking = false;

	// 停止main_state 的hook
	// 但不停止coroutine的hook因为没有办法知道这个lua state 指针是否有效
	// stop在交互线程，不应该设置hook
	// 而且清理对lua_state 的 hook没有必要
	// UpdateHook(0, mainL);

	// 清理hook 状态
	{
		std::lock_guard<std::mutex> lock(hookStateMtx);
		hookState = nullptr;
	}

	{
		// clear lua thread executors
		std::unique_lock<std::mutex> luaThreadLock(luaThreadMtx);
		luaThreadExecutors.clear();
	}
	ExitDebugMode();
}